

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O1

string * __thiscall
IDLExport::getIDLAbsolute_abi_cxx11_(string *__return_storage_ptr__,IDLExport *this,Type *type)

{
  string local_30;
  
  local_30._M_string_length = 0;
  local_30.field_2._M_local_buf[0] = '\0';
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  anon_unknown.dwarf_196f0::getIDLAbsolute(__return_storage_ptr__,type,this,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string IDLExport::getIDLAbsolute(Type const& type) const
{
    return ::getIDLAbsolute(type, *this);
}